

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDriver.cpp
# Opt level: O0

quint64 __thiscall AudioStream::estimateMIDITimestamp(AudioStream *this,MasterClockNanos midiNanos)

{
  bool bVar1;
  QDebug *pQVar2;
  quint64 local_c8;
  QMessageLogger local_78;
  QDebug local_58;
  long local_50;
  qint64 delay;
  qint64 timestamp;
  qint64 refFrameOffset;
  quint64 renderedFramesCount;
  TimeInfo timeInfo;
  MasterClockNanos midiNanos_local;
  AudioStream *this_local;
  
  timeInfo.actualSampleRate = (double)midiNanos;
  takeSnapshot<AudioStream::TimeInfo>
            ((TimeInfo *)&renderedFramesCount,this->timeInfos,&this->timeInfoChangeCount);
  takeSnapshot<unsigned_long_long>
            ((unsigned_long_long *)&refFrameOffset,this->renderedFramesCounts,
             &this->renderedFramesChangeCount);
  timestamp = (qint64)(((double)(long)((long)timeInfo.actualSampleRate - renderedFramesCount) *
                       (double)timeInfo.lastPlayedFramesCount) / 1000000000.0);
  delay = timeInfo.lastPlayedNanos + timestamp + (ulong)this->midiLatencyFrames;
  local_50 = delay - refFrameOffset;
  if (local_50 < 0) {
    bVar1 = isAutoLatencyMode(this);
    if (bVar1) {
      this->midiLatencyFrames = this->midiLatencyFrames - (int)local_50;
    }
    QMessageLogger::QMessageLogger(&local_78,(char *)0x0,0,(char *)0x0);
    QMessageLogger::debug();
    pQVar2 = QDebug::operator<<(&local_58,"L");
    pQVar2 = QDebug::operator<<(pQVar2,refFrameOffset);
    pQVar2 = QDebug::operator<<(pQVar2,delay);
    pQVar2 = QDebug::operator<<(pQVar2,local_50);
    QDebug::operator<<(pQVar2,this->midiLatencyFrames);
    QDebug::~QDebug(&local_58);
  }
  if (delay < 0) {
    local_c8 = 0;
  }
  else {
    local_c8 = delay;
  }
  return local_c8;
}

Assistant:

quint64 AudioStream::estimateMIDITimestamp(const MasterClockNanos midiNanos) {
	TimeInfo timeInfo;
	takeSnapshot(timeInfo, timeInfos, timeInfoChangeCount);
	quint64 renderedFramesCount;
	takeSnapshot(renderedFramesCount, renderedFramesCounts, renderedFramesChangeCount);

	qint64 refFrameOffset = qint64(((midiNanos - timeInfo.lastPlayedNanos) * timeInfo.actualSampleRate) / MasterClock::NANOS_PER_SECOND);
	qint64 timestamp = qint64(timeInfo.lastPlayedFramesCount) + refFrameOffset + qint64(midiLatencyFrames);
	qint64 delay = timestamp - qint64(renderedFramesCount);
	if (delay < 0) {
		// Negative delay means our timing is broken. We want to absorb all the jitter while keeping the latency at the minimum.
		if (isAutoLatencyMode()) {
			midiLatencyFrames -= delay;
		}
		qDebug() << "L" << renderedFramesCount << timestamp << delay << midiLatencyFrames;
	}
	return timestamp < 0 ? 0 : quint64(timestamp);
}